

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O2

void __thiscall xray_re::_lzhuf::EncodeChar(_lzhuf *this,uint c)

{
  uint uVar1;
  uint c_00;
  int l;
  
  uVar1 = this->prnt[c + 0x273];
  c_00 = 0;
  l = 0;
  do {
    c_00 = (uVar1 & 1) * 0x8000 + (c_00 >> 1);
    l = l + 1;
    uVar1 = this->prnt[(int)uVar1];
  } while (uVar1 != 0x272);
  Putcode(this,l,c_00);
  update(this,c);
  return;
}

Assistant:

void _lzhuf::EncodeChar(unsigned c)
{
	unsigned i;
	int j, k;

	i = 0;
	j = 0;
	k = prnt[c + T];

	/* travel from leaf to root */
	do {
		i >>= 1;

		/* if node's address is odd-numbered, choose bigger brother node */
		if (k & 1) i += 0x8000;

		j++;
	} while ((k = prnt[k]) != R);
	Putcode(j, i);
//	code = i;
//	len = j;
	update(c);
}